

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.cpp
# Opt level: O0

optional_ptr<duckdb::CatalogEntry,_true> __thiscall
duckdb::Catalog::CreateIndex(Catalog *this,CatalogTransaction transaction,CreateIndexInfo *info)

{
  CatalogTransaction transaction_00;
  CatalogTransaction transaction_01;
  int iVar1;
  SchemaCatalogEntry *pSVar2;
  TableCatalogEntry *pTVar3;
  undefined4 extraout_var;
  undefined8 in_RSI;
  transaction_t in_RDI;
  TableCatalogEntry *table;
  SchemaCatalogEntry *schema;
  undefined1 local_a8 [40];
  undefined1 local_80 [8];
  CatalogEntry *pCStack_78;
  string *in_stack_ffffffffffffff98;
  Catalog *in_stack_ffffffffffffffa0;
  string *in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb0;
  undefined7 uVar4;
  CatalogType in_stack_ffffffffffffffb7;
  undefined1 uVar5;
  SchemaCatalogEntry *in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffc8;
  transaction_t in_stack_ffffffffffffffd0;
  undefined8 in_stack_ffffffffffffffd8;
  
  memcpy(&stack0xffffffffffffffb8,&stack0x00000008,0x28);
  transaction_00.db.ptr._7_1_ = in_stack_ffffffffffffffb7;
  transaction_00.db.ptr._0_7_ = in_stack_ffffffffffffffb0;
  transaction_00.context.ptr = (ClientContext *)in_stack_ffffffffffffffb8;
  transaction_00.transaction.ptr = (Transaction *)in_stack_ffffffffffffffc0;
  transaction_00.transaction_id = in_stack_ffffffffffffffc8;
  transaction_00.start_time = in_stack_ffffffffffffffd0;
  pSVar2 = GetSchema(in_stack_ffffffffffffffa0,transaction_00,in_stack_ffffffffffffff98);
  memcpy(local_80,&stack0x00000008,0x28);
  transaction_01.context.ptr = (ClientContext *)in_stack_ffffffffffffffd8;
  transaction_01.db.ptr = (DatabaseInstance *)in_stack_ffffffffffffffd0;
  transaction_01.transaction.ptr = (Transaction *)pSVar2;
  transaction_01.transaction_id = in_RSI;
  transaction_01.start_time = in_RDI;
  SchemaCatalogEntry::GetEntry
            (in_stack_ffffffffffffffb8,transaction_01,in_stack_ffffffffffffffb7,
             in_stack_ffffffffffffffa8);
  optional_ptr<duckdb::CatalogEntry,_true>::operator->
            ((optional_ptr<duckdb::CatalogEntry,_true> *)pCStack_78);
  pTVar3 = CatalogEntry::Cast<duckdb::TableCatalogEntry>(pCStack_78);
  uVar4 = SUB87(pTVar3,0);
  uVar5 = (undefined1)((ulong)pTVar3 >> 0x38);
  memcpy(local_a8,&stack0x00000008,0x28);
  iVar1 = (*(pSVar2->super_InCatalogEntry).super_CatalogEntry._vptr_CatalogEntry[0x12])
                    (pSVar2,in_RSI,CONCAT17(uVar5,uVar4));
  return (optional_ptr<duckdb::CatalogEntry,_true>)(CatalogEntry *)CONCAT44(extraout_var,iVar1);
}

Assistant:

optional_ptr<CatalogEntry> Catalog::CreateIndex(CatalogTransaction transaction, CreateIndexInfo &info) {
	auto &schema = GetSchema(transaction, info.schema);
	auto &table = schema.GetEntry(transaction, CatalogType::TABLE_ENTRY, info.table)->Cast<TableCatalogEntry>();
	return schema.CreateIndex(transaction, info, table);
}